

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

size_t RVO::linearProgram2(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,float radius,
                          Vector2 *optVelocity,bool directionOpt,Vector2 *result)

{
  float fVar1;
  Vector2 VVar2;
  bool bVar3;
  size_t sVar4;
  pointer pLVar5;
  undefined7 in_register_00000011;
  pointer pLVar6;
  size_t lineNo;
  long lVar7;
  float fVar8;
  float fVar9;
  
  fVar9 = optVelocity->x_;
  if ((int)CONCAT71(in_register_00000011,directionOpt) == 0) {
    fVar1 = optVelocity->y_;
    fVar8 = fVar9 * fVar9 + fVar1 * fVar1;
    if (fVar8 <= radius * radius) {
      *result = *optVelocity;
      goto LAB_00108312;
    }
    fVar8 = 1.0 / SQRT(fVar8);
    fVar9 = fVar8 * fVar9;
    fVar8 = fVar8 * fVar1;
  }
  else {
    fVar8 = optVelocity->y_;
  }
  VVar2.y_ = radius * fVar8;
  VVar2.x_ = radius * fVar9;
  *result = VVar2;
LAB_00108312:
  pLVar5 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar6 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar6 == pLVar5) {
    sVar4 = 0;
  }
  else {
    lVar7 = 0xc;
    lineNo = 0;
    do {
      if (0.0 < (*(float *)((long)pLVar5 + lVar7 + -8) - result->y_) *
                *(float *)((long)pLVar5 + lVar7 + -4) -
                (*(float *)((long)pLVar5 + lVar7 + -0xc) - result->x_) *
                *(float *)((long)&(pLVar5->point).x_ + lVar7)) {
        VVar2 = *result;
        bVar3 = linearProgram1(lines,lineNo,radius,optVelocity,directionOpt,result);
        if (!bVar3) {
          *result = VVar2;
          return lineNo;
        }
        pLVar5 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar6 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lineNo = lineNo + 1;
      sVar4 = (long)pLVar6 - (long)pLVar5 >> 4;
      lVar7 = lVar7 + 0x10;
    } while (lineNo < sVar4);
  }
  return sVar4;
}

Assistant:

size_t linearProgram2(const std::vector<Line> &lines, float radius, const Vector2 &optVelocity, bool directionOpt, Vector2 &result)
	{
		if (directionOpt) {
			/*
			 * Optimize direction. Note that the optimization velocity is of unit
			 * length in this case.
			 */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector2 tempResult = result;

				if (!linearProgram1(lines, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return lines.size();
	}